

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O2

uint32_t __thiscall
google::protobuf::internal::ReflectionSchema::GetFieldOffset
          (ReflectionSchema *this,FieldDescriptor *field)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  OneofDescriptor *pOVar4;
  byte bVar5;
  
  pOVar4 = FieldDescriptor::real_containing_oneof(field);
  if (pOVar4 != (OneofDescriptor *)0x0) {
    iVar1 = field->containing_type_->field_count_;
    pOVar4 = FieldDescriptor::containing_oneof(field);
    bVar5 = field->type_ - 9;
    uVar2 = 0x7fffffff;
    if (bVar5 < 4) {
      uVar2 = *(uint *)(&DAT_0033bbf0 + (ulong)bVar5 * 4);
    }
    return uVar2 & this->offsets_
                   [(long)iVar1 +
                    (long)(int)(((long)pOVar4 - (long)pOVar4->containing_type_->oneof_decls_) / 0x38
                               )];
  }
  uVar3 = GetFieldOffsetNonOneof(this,field);
  return uVar3;
}

Assistant:

uint32_t GetFieldOffset(const FieldDescriptor* field) const {
    if (InRealOneof(field)) {
      size_t offset =
          static_cast<size_t>(field->containing_type()->field_count()) +
          field->containing_oneof()->index();
      return OffsetValue(offsets_[offset], field->type());
    } else {
      return GetFieldOffsetNonOneof(field);
    }
  }